

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pdfa.c
# Opt level: O1

void HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)

{
  HPDF_List list;
  HPDF_MMgr mmgr;
  void *aptr;
  HPDF_UINT index;
  
  list = pdf->xmp_extensions;
  if (list->count != 0) {
    index = 0;
    do {
      mmgr = pdf->mmgr;
      aptr = HPDF_List_ItemAt(list,index);
      HPDF_FreeMem(mmgr,aptr);
      index = index + 1;
    } while (index < list->count);
  }
  HPDF_List_Clear(pdf->xmp_extensions);
  return;
}

Assistant:

void
HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)
{
    HPDF_UINT i;
    HPDF_List list;

    list = pdf->xmp_extensions;
    for (i = 0; i < list->count; i++) {
        HPDF_FreeMem(pdf->mmgr, HPDF_List_ItemAt(list, i));
    }
    HPDF_List_Clear(pdf->xmp_extensions);
}